

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O3

bool __thiscall OSToken::getTokenFlags(OSToken *this,CK_ULONG *flags)

{
  int iVar1;
  unsigned_long uVar2;
  OSAttribute local_c0;
  
  if (((this->valid == true) &&
      (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[10])(), (char)iVar1 != '\0')) &&
     (iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534b)
     , (char)iVar1 != '\0')) {
    (*(this->tokenObject->super_OSObject)._vptr_OSObject[3])(&local_c0,this->tokenObject,0x8000534b)
    ;
    uVar2 = OSAttribute::getUnsignedLongValue(&local_c0);
    *flags = uVar2;
    OSAttribute::~OSAttribute(&local_c0);
    iVar1 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534d);
    if ((char)iVar1 == '\0') {
      return true;
    }
    *(byte *)flags = (byte)*flags | 8;
    return true;
  }
  return false;
}

Assistant:

bool OSToken::getTokenFlags(CK_ULONG& flags)
{
	if (!valid || !tokenObject->isValid())
	{
		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_TOKENFLAGS))
	{
		flags = tokenObject->getAttribute(CKA_OS_TOKENFLAGS).getUnsignedLongValue();

		// Check if the user PIN is initialised
		if (tokenObject->attributeExists(CKA_OS_USERPIN))
		{
			flags |= CKF_USER_PIN_INITIALIZED;
		}

		return true;
	}
	else
	{
		return false;
	}
}